

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

void pageant_conn_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  if (type == PLUGCLOSE_NORMAL) {
    pageant_listener_client_log
              ((PageantListenerClient *)plug[-0x800e].vt,"c#%zu: connection closed",plug[-0xb].vt,
               error_msg);
  }
  else {
    pageant_listener_client_log
              ((PageantListenerClient *)plug[-0x800e].vt,"c#%zu: error: %s",plug[-0xb].vt,error_msg)
    ;
  }
  (**(code **)((plug[-0x800f].vt)->log + 8))();
  pageant_unregister_client((PageantClient *)(plug + -3));
  safefree(plug + -0x800f);
  return;
}

Assistant:

static void pageant_conn_closing(Plug *plug, PlugCloseType type,
                                 const char *error_msg)
{
    struct pageant_conn_state *pc = container_of(
        plug, struct pageant_conn_state, plug);
    if (type != PLUGCLOSE_NORMAL)
        pageant_listener_client_log(pc->plc, "c#%"SIZEu": error: %s",
                                    pc->conn_index, error_msg);
    else
        pageant_listener_client_log(pc->plc, "c#%"SIZEu": connection closed",
                                    pc->conn_index);
    sk_close(pc->connsock);
    pageant_unregister_client(&pc->pc);
    sfree(pc);
}